

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O2

int __thiscall miniros::TransportUDP::close(TransportUDP *this,int __fd)

{
  Callback *__x;
  uint uVar1;
  Level level;
  void *logger_handle;
  int iVar2;
  int extraout_EAX;
  char *pcVar3;
  allocator<char> local_69;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Callback disconnect_cb;
  
  disconnect_cb.super__Function_base._M_manager = (_Manager_type)0x0;
  disconnect_cb._M_invoker = (_Invoker_type)0x0;
  disconnect_cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  disconnect_cb.super__Function_base._M_functor._8_8_ = 0;
  if (this->closed_ == false) {
    std::mutex::lock(&this->close_mutex_);
    if (this->closed_ == false) {
      this->closed_ = true;
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (close::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"miniros.transport_udp",&local_69);
        console::initializeLogLocation(&close::loc,(string *)local_68,Debug);
        std::__cxx11::string::~string((string *)local_68);
      }
      if (close::loc.level_ != Debug) {
        console::setLogLocationLevel(&close::loc,Debug);
        console::checkLogLocationEnabled(&close::loc);
      }
      if (close::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,close::loc.logger_,close::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                       ,0x141,"virtual void miniros::TransportUDP::close()","UDP socket [%d] closed"
                       ,(ulong)(uint)this->sock_);
      }
      if (this->poll_set_ != (PollSet *)0x0) {
        PollSet::delSocket(this->poll_set_,this->sock_);
      }
      iVar2 = close_socket(&this->sock_);
      if (iVar2 != 0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (close()::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_68,"miniros.transport_udp",&local_69);
          console::initializeLogLocation(&close()::loc,(string *)local_68,Error);
          std::__cxx11::string::~string((string *)local_68);
        }
        if (close()::loc.level_ != Error) {
          console::setLogLocationLevel(&close()::loc,Error);
          console::checkLogLocationEnabled(&close()::loc);
        }
        logger_handle = close()::loc.logger_;
        level = close()::loc.level_;
        if (close()::loc.logger_enabled_ == true) {
          uVar1 = this->sock_;
          pcVar3 = last_socket_error_string();
          console::print((FilterBase *)0x0,logger_handle,level,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                         ,0x14c,"virtual void miniros::TransportUDP::close()",
                         "Error closing socket [%d]: [%s]",(ulong)uVar1,pcVar3);
        }
      }
      this->sock_ = -1;
      __x = &(this->super_Transport).disconnect_cb_;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (&disconnect_cb,__x);
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = (_Invoker_type)0x0;
      local_68._0_8_ = (void *)0x0;
      local_68._8_8_ = 0;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (__x,(function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)local_68);
      std::_Function_base::~_Function_base((_Function_base *)local_68);
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = (_Invoker_type)0x0;
      local_68._0_8_ = (void *)0x0;
      local_68._8_8_ = 0;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (&(this->super_Transport).read_cb_,
                 (function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)local_68);
      std::_Function_base::~_Function_base((_Function_base *)local_68);
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = (_Invoker_type)0x0;
      local_68._0_8_ = (void *)0x0;
      local_68._8_8_ = 0;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (&(this->super_Transport).write_cb_,
                 (function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)local_68);
      std::_Function_base::~_Function_base((_Function_base *)local_68);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex_);
    if (disconnect_cb.super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Transport,void>
                ((__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> *)local_68,
                 (__weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_Transport).super_enable_shared_from_this<miniros::Transport>);
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator()
                (&disconnect_cb,(shared_ptr<miniros::Transport> *)local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    }
  }
  std::_Function_base::~_Function_base(&disconnect_cb.super__Function_base);
  return extraout_EAX;
}

Assistant:

bool TransportUDP::createIncoming(int port, bool is_server)
{
  is_server_ = is_server;

  sock_ = socket(AF_INET, SOCK_DGRAM, 0);

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]", last_socket_error_string());
    return false;
  }

  server_address_.sin_family = AF_INET;
  server_address_.sin_port = htons(port);
  server_address_.sin_addr.s_addr = isOnlyLocalhostAllowed() ? 
                                    htonl(INADDR_LOOPBACK) :
                                    INADDR_ANY;
  if (bind(sock_, (sockaddr *)&server_address_, sizeof(server_address_)) < 0)
  {
    MINIROS_ERROR("bind() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  socklen_t len = sizeof(server_address_);
  getsockname(sock_, (sockaddr *)&server_address_, &len);
  server_port_ = ntohs(server_address_.sin_port);
  MINIROS_DEBUG("UDPROS server listening on port [%d]", server_port_);

  if (!initializeSocket())
  {
    return false;
  }

  enableRead();

  return true;
}